

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluj.c
# Opt level: O3

int fffi2u8(short *input,long ntodo,double scale,double zero,int nullcheck,short tnull,
           ULONGLONG nullval,char *nullarray,int *anynull,ULONGLONG *output,int *status)

{
  ULONGLONG UVar1;
  long lVar2;
  double dVar3;
  
  if (nullcheck == 0) {
    if (scale != 1.0 || zero != 0.0) {
      if (0 < ntodo) {
        lVar2 = 0;
        do {
          dVar3 = (double)(int)input[lVar2] * scale + zero;
          if (-9.223372036854776e+18 <= dVar3) {
            if (dVar3 <= 9.223372036854776e+18) {
              UVar1 = (ULONGLONG)dVar3;
            }
            else {
              *status = -0xb;
              UVar1 = 0x7fffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            UVar1 = 0x8000000000000000;
          }
          output[lVar2] = UVar1;
          lVar2 = lVar2 + 1;
        } while (ntodo != lVar2);
      }
    }
    else if (0 < ntodo) {
      lVar2 = 0;
      do {
        UVar1 = (ULONGLONG)input[lVar2];
        if ((long)UVar1 < 0) {
          *status = -0xb;
          UVar1 = 0;
        }
        output[lVar2] = UVar1;
        lVar2 = lVar2 + 1;
      } while (ntodo != lVar2);
    }
  }
  else if (scale != 1.0 || zero != 0.0) {
    if (0 < ntodo) {
      lVar2 = 0;
      do {
        if (input[lVar2] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar2] = nullval;
          }
          else {
            nullarray[lVar2] = '\x01';
          }
        }
        else {
          dVar3 = (double)(int)input[lVar2] * scale + zero;
          if (-9.223372036854776e+18 <= dVar3) {
            if (dVar3 <= 9.223372036854776e+18) {
              output[lVar2] = (long)dVar3;
            }
            else {
              *status = -0xb;
              output[lVar2] = 0x7fffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            output[lVar2] = 0x8000000000000000;
          }
        }
        lVar2 = lVar2 + 1;
      } while (ntodo != lVar2);
    }
  }
  else if (0 < ntodo) {
    lVar2 = 0;
    do {
      if (input[lVar2] == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar2] = nullval;
        }
        else {
          nullarray[lVar2] = '\x01';
        }
      }
      else {
        output[lVar2] = (long)input[lVar2];
      }
      lVar2 = lVar2 + 1;
    } while (ntodo != lVar2);
  }
  return *status;
}

Assistant:

int fffi2u8(short *input,         /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            short tnull,          /* I - value of FITS TNULLn keyword if any */
            ULONGLONG nullval,     /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            ULONGLONG *output,     /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
	    {
	        if (input[ii] < 0) 
		{
                   *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
		else
		{
                    output[ii] = (ULONGLONG) input[ii];   /* copy input to output */
                }
	    }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DLONGLONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = LONGLONG_MIN;
                }
                else if (dvalue > DLONGLONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = LONGLONG_MAX;
                }
                else
                    output[ii] = (LONGLONG) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                    output[ii] = (LONGLONG) input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DLONGLONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONGLONG_MIN;
                    }
                    else if (dvalue > DLONGLONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = LONGLONG_MAX;
                    }
                    else
                        output[ii] = (LONGLONG) dvalue;
                }
            }
        }
    }
    return(*status);
}